

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O2

char ** str_split(char *str,char *delim,int *elts)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char **__s;
  char *pcVar4;
  size_t num;
  int iVar5;
  char **ppcVar6;
  char *tmp;
  
  if (delim == (char *)0x0 || str == (char *)0x0) {
    __s = (char **)0x0;
  }
  else {
    iVar5 = 1;
    pcVar4 = str;
    do {
      pcVar2 = strpbrk(pcVar4,delim);
      if (pcVar2 == (char *)0x0) break;
      pcVar4 = pcVar2 + 1;
      iVar5 = iVar5 + 1;
    } while (pcVar2[1] != '\0');
    sVar3 = strlen(str);
    num = sVar3 + (long)iVar5 * 8 + 9;
    __s = (char **)zt_malloc_p(num);
    memset(__s,0,num);
    tmp = (char *)(__s + (long)iVar5 + 1);
    sVar3 = strlen(str);
    strncpy((char *)(__s + (long)iVar5 + 1),str,sVar3);
    *elts = iVar5;
    ppcVar6 = __s;
    do {
      do {
        pcVar4 = strsep(&tmp,delim);
        *ppcVar6 = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return __s;
        }
      } while (*pcVar4 == '\0');
      ppcVar6 = ppcVar6 + 1;
      bVar1 = 1 < iVar5;
      iVar5 = iVar5 + -1;
    } while (bVar1);
  }
  return __s;
}

Assistant:

char **str_split(char *str, char * delim, int *elts)
{
    char * p1;
    char **ap;
    char **argv;
    int    argc;
    char * tmp;
    size_t memsize;

    if (str == NULL || delim == NULL) {
        return NULL;
    }

    argc = 1;
    p1 = str;
    while ((p1 = strpbrk(p1, delim)) != NULL) {
        ++p1;
        argc += 1;
        if (*p1 == '\0') {
            break;
        }
    }

    /* calculate the size of the char *vector then add the string to
     * the end of that (includeing null space for the empty vector
     * spot and the NUL char
     */
    memsize = (sizeof(char *) * (argc + 1)) + (sizeof(char) * (strlen(str) + 1));

    argv = (char **)zt_malloc(char, memsize);
    memset(argv, '\0', memsize);

    tmp = (char *)argv + (sizeof(char *) * (argc + 1));
    strncpy(tmp, str, strlen(str));

    *elts = argc;

    for (ap = argv; (*ap = strsep(&tmp, delim)) != NULL; ) {
        if (**ap != '\0') {
            ++ap;
            if (--argc <= 0) {
                break;
            }
        }
    }

    return argv;
}